

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O3

int parse_calculation_line(char *line,char *full_line)

{
  char *s;
  char cVar1;
  uint uVar2;
  void **ppvVar3;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  borg_calculation *f;
  borg_array *pbVar8;
  ushort **ppuVar9;
  undefined4 *puVar10;
  undefined4 *item;
  int *item_00;
  size_t sVar11;
  value_sec *p;
  long lVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  bool bVar20;
  char local_438 [1032];
  
  f = (borg_calculation *)mem_zalloc(0x10);
  pbVar8 = (borg_array *)mem_zalloc(0x10);
  f->token_array = pbVar8;
  if (*line != '\0') {
    bVar5 = false;
    bVar4 = false;
    iVar7 = 0;
    pcVar13 = line;
LAB_00223667:
    pcVar18 = pcVar13 + -1;
    lVar12 = 0;
LAB_0022366f:
    s = pcVar13 + lVar12;
    _Var6 = prefix_i(s,"value");
    if (_Var6) goto LAB_00223845;
    cVar1 = *s;
    if (cVar1 == ')') {
      iVar17 = -1;
      if (0 < iVar7) {
LAB_00223a68:
        iVar7 = iVar7 + iVar17;
        pcVar18 = pcVar13 + lVar12 + 1;
        cVar1 = *pcVar18;
        goto joined_r0x00223a7d;
      }
      pcVar13 = "** unmatched parenthesis";
      goto LAB_00223ba8;
    }
    if (cVar1 == '(') {
      iVar17 = 1;
      goto LAB_00223a68;
    }
    if (cVar1 == '!') {
      pcVar18 = pcVar13 + lVar12 + 1;
      cVar1 = *pcVar18;
      bVar4 = true;
      goto joined_r0x00223a7d;
    }
    ppuVar9 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar9 + (long)cVar1 * 2 + 1) & 8) != 0) {
LAB_002237a4:
      puVar10 = (undefined4 *)mem_alloc(4);
      lVar12 = atol(s);
      *puVar10 = (int)lVar12;
      if (f->max_depth < iVar7) {
        f->max_depth = iVar7;
      }
      pbVar8 = f->token_array;
      item = (undefined4 *)mem_zalloc(0x18);
      *item = 2;
      *(undefined4 **)(item + 2) = puVar10;
      item[4] = iVar7;
      *(bool *)(item + 1) = bVar4;
      borg_array_add(pbVar8,item);
      do {
        do {
          cVar1 = pcVar18[1];
          pcVar18 = pcVar18 + 1;
        } while ((long)cVar1 == 0x2d);
      } while (((*ppuVar9)[cVar1] & 0x800) != 0);
      bVar4 = false;
      goto joined_r0x00223a7d;
    }
    switch(cVar1) {
    case '*':
      pcVar18 = pcVar13 + lVar12 + 1;
      iVar17 = 5;
      break;
    case '+':
      pcVar18 = pcVar13 + lVar12 + 1;
      iVar17 = 4;
      break;
    default:
      _Var6 = prefix_i(s,"and");
      if (_Var6) {
        lVar12 = lVar12 + 3;
LAB_002238a8:
        pcVar18 = pcVar13 + lVar12;
        iVar17 = 7;
        break;
      }
      _Var6 = prefix_i(s,"&&");
      if (_Var6) {
        lVar12 = lVar12 + 2;
        goto LAB_002238a8;
      }
      _Var6 = prefix_i(s,"or");
      if ((_Var6) || (_Var6 = prefix_i(s,"||"), _Var6)) {
        pcVar18 = pcVar13 + lVar12 + 2;
        iVar17 = 8;
        break;
      }
      cVar1 = pcVar13[lVar12];
      if (cVar1 == '<') {
        bVar20 = pcVar13[lVar12 + 1] == '=';
        pcVar18 = pcVar13 + lVar12 + 2;
        if (!bVar20) {
          pcVar18 = pcVar13 + lVar12 + 1;
        }
        iVar17 = (uint)bVar20 * 2 + 10;
        break;
      }
      if (cVar1 == '=') {
        pcVar18 = pcVar13 + lVar12 + 1;
        iVar17 = 9;
        break;
      }
      if (cVar1 == '>') {
        bVar20 = pcVar13[lVar12 + 1] == '=';
        pcVar18 = pcVar13 + lVar12 + 2;
        if (!bVar20) {
          pcVar18 = pcVar13 + lVar12 + 1;
        }
        iVar17 = (uint)bVar20 * 2 + 0xb;
        break;
      }
      pcVar18 = pcVar18 + 1;
      lVar14 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      if (pcVar13[lVar14] == '\0') goto LAB_00223a8f;
      goto LAB_0022366f;
    case '-':
      if ((*(byte *)((long)*ppuVar9 + (long)pcVar13[lVar12 + 1] * 2 + 1) & 8) != 0)
      goto LAB_002237a4;
      pcVar18 = pcVar13 + lVar12 + 1;
      iVar17 = 3;
      break;
    case '/':
      pcVar18 = pcVar13 + lVar12 + 1;
      iVar17 = 6;
    }
    if (f->max_depth < iVar7) {
      f->max_depth = iVar7;
    }
    pbVar8 = f->token_array;
    item_00 = (int *)mem_zalloc(0x18);
    *item_00 = iVar17;
    item_00[2] = 0;
    item_00[3] = 0;
    item_00[4] = iVar7;
    *(undefined1 *)(item_00 + 1) = 0;
    borg_array_add(pbVar8,item_00);
    if (bVar4) {
      borg_formula_error(line,full_line,"calculation","** not (!) can only be applied to values");
      bVar5 = true;
    }
    goto LAB_00223a30;
  }
LAB_00223ab6:
  if (-1 < f->max_depth) {
    iVar7 = 0;
    do {
      pbVar8 = f->token_array;
      uVar16 = (ulong)(uint)pbVar8->count;
      if (0 < pbVar8->count) {
        uVar19 = 0;
LAB_00223ad2:
        lVar12 = (long)(int)uVar16;
        uVar15 = 0xffffffff;
        uVar16 = uVar19;
        do {
          iVar17 = *(int *)((long)pbVar8->items[uVar16] + 0x10);
          if ((int)uVar15 == -1) {
            uVar15 = 0xffffffff;
            if (iVar17 == iVar7) {
              uVar15 = uVar16 & 0xffffffff;
            }
          }
          else if (iVar17 < iVar7) goto LAB_00223b05;
          uVar16 = uVar16 + 1;
          if (lVar12 <= (long)uVar16) {
            if ((int)uVar15 != -1) {
              lVar14 = uVar19 + 1;
              if ((long)(uVar19 + 1) <= lVar12) {
                lVar14 = lVar12;
              }
              adjust_order_ops_depth_block(f,iVar7,(int)uVar15,(int)lVar14 + -1);
            }
            break;
          }
        } while( true );
      }
LAB_00223b42:
      bVar4 = iVar7 < f->max_depth;
      iVar7 = iVar7 + 1;
    } while (bVar4);
  }
  uVar2 = f->token_array->count;
  if ((ulong)uVar2 == 0) {
    pcVar13 = "** formula must contain values";
  }
  else {
    ppvVar3 = f->token_array->items;
    if (0 < (int)uVar2) {
      uVar16 = 0;
      pcVar13 = "** formula must be values separated by operators";
      do {
        if (((uVar16 & 1) == 0) == 2 < *ppvVar3[uVar16]) goto LAB_00223ba8;
        uVar16 = uVar16 + 1;
      } while (uVar2 != uVar16);
    }
    if (*ppvVar3[(long)(int)uVar2 + -1] < 3) {
      iVar7 = borg_array_add(&calculations,f);
      if (iVar7 == -1) {
        borg_formula_error(line,full_line,"calculation","** can\'t add to formula array");
        return -1;
      }
      return iVar7;
    }
    pcVar13 = "** formula can\'t end in an operation";
  }
LAB_00223ba8:
  borg_formula_error(line,full_line,"calculation",pcVar13);
LAB_00223bbe:
  calc_free(f);
  return -1;
LAB_00223845:
  pcVar18 = strchr(s,0x29);
  if (pcVar18 == (char *)0x0) {
    sVar11 = strlen(s);
    iVar17 = (int)sVar11;
  }
  else {
    iVar17 = (((int)pcVar18 - (int)pcVar13) - (int)lVar12) + 1;
  }
  strncpy(local_438,s,(long)iVar17);
  local_438[iVar17] = '\0';
  pcVar13 = string_make(local_438);
  sVar11 = strlen(pcVar13);
  p = parse_value(pcVar13,full_line);
  if (p == (value_sec *)0x0) {
    bVar5 = true;
  }
  mem_free(pcVar13);
  if (bVar5) {
    mem_free(p);
    goto LAB_00223a8f;
  }
  if (f->max_depth < iVar7) {
    f->max_depth = iVar7;
  }
  pcVar18 = s + sVar11;
  pbVar8 = f->token_array;
  puVar10 = (undefined4 *)mem_zalloc(0x18);
  *puVar10 = 1;
  *(value_sec **)(puVar10 + 2) = p;
  puVar10[4] = iVar7;
  *(bool *)(puVar10 + 1) = bVar4;
  borg_array_add(pbVar8,puVar10);
  bVar4 = false;
LAB_00223a30:
  cVar1 = *pcVar18;
joined_r0x00223a7d:
  pcVar13 = pcVar18;
  if (cVar1 == '\0') goto LAB_00223a8f;
  goto LAB_00223667;
LAB_00223a8f:
  if (iVar7 == 0) {
    if (bVar5) goto LAB_00223bbe;
    goto LAB_00223ab6;
  }
  pcVar13 = "** unmatched parenthesis";
  if (bVar5) goto LAB_00223bbe;
  goto LAB_00223ba8;
LAB_00223b05:
  adjust_order_ops_depth_block(f,iVar7,(int)uVar15,(int)uVar16 + -1);
  pbVar8 = f->token_array;
  uVar19 = uVar16 + 1;
  uVar16 = (ulong)pbVar8->count;
  if ((long)uVar16 <= (long)uVar19) goto LAB_00223b42;
  goto LAB_00223ad2;
}

Assistant:

int parse_calculation_line(char *line, const char *full_line)
{
    struct borg_calculation *f = mem_zalloc(sizeof(struct borg_calculation));
    if (parse_calculation(f, line, full_line)) {
        calc_free(f);
        f = NULL;
        return -1;
    }

    int i = borg_array_add(&calculations, f);
    if (i == -1)
        borg_formula_error(
            line, full_line, "calculation", "** can't add to formula array");
    return i;
}